

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O0

void __thiscall
ScriptHash_ScriptHash_script_legacy_Test::TestBody(ScriptHash_ScriptHash_script_legacy_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  string local_d0 [32];
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  ScriptHash script_hash;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  Script script;
  ScriptHash_ScriptHash_script_legacy_Test *this_local;
  
  script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac",&local_69);
  cfd::core::Script::Script((Script *)local_48,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  cfd::core::ScriptHash::ScriptHash((ScriptHash *)&gtest_ar.message_,(Script *)local_48,false);
  cfd::core::ScriptHash::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b0,"script_hash.GetHex().c_str()",
             "\"a9140e83a9df2e7937d27e90a26a06857407e39eb47487\"",pcVar2,
             "a9140e83a9df2e7937d27e90a26a06857407e39eb47487");
  std::__cxx11::string::~string(local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scripthash.cpp"
               ,0x36,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  cfd::core::ScriptHash::~ScriptHash((ScriptHash *)&gtest_ar.message_);
  cfd::core::Script::~Script((Script *)local_48);
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_script_legacy) {
  Script script("76a91498e977b2259a85278aa51188bd863a3df0ad31ba88ac");
  ScriptHash script_hash(script, false);
  // OP_HASH160 Hash160(script) OP_EQUAL
  EXPECT_STREQ(script_hash.GetHex().c_str(),
               "a9140e83a9df2e7937d27e90a26a06857407e39eb47487");
}